

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void * op_freopen(OpusFileCallbacks *_cb,char *_path,char *_mode,void *_stream)

{
  FILE *pFVar1;
  
  pFVar1 = freopen64(_path,_mode,(FILE *)_stream);
  if (pFVar1 != (FILE *)0x0) {
    _cb->tell = op_ftell;
    _cb->close = fclose;
    _cb->read = op_fread;
    _cb->seek = op_fseek;
  }
  return pFVar1;
}

Assistant:

void *op_freopen(OpusFileCallbacks *_cb,const char *_path,const char *_mode,
 void *_stream){
  FILE *fp;
#if !defined(_WIN32)
  fp=freopen(_path,_mode,(FILE *)_stream);
#else
  fp=NULL;
  {
    wchar_t *wpath;
    wchar_t *wmode;
    wpath=op_utf8_to_utf16(_path);
    wmode=op_utf8_to_utf16(_mode);
    if(wmode==NULL)errno=EINVAL;
    else if(wpath==NULL)errno=ENOENT;
    else fp=_wfreopen(wpath,wmode,(FILE *)_stream);
    _ogg_free(wmode);
    _ogg_free(wpath);
  }
#endif
  if(fp!=NULL)*_cb=*op_get_file_callbacks(fp);
  return fp;
}